

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_float.c
# Opt level: O0

vf_base_t vf_deflate_with_overflow
                    (vf_base_t input,vf_profile_t profile_in,vf_profile_t profile_out,
                    vf_status_t *status)

{
  ulong uVar1;
  vf_base_t output;
  vf_base_t output_1;
  vf_base_t mnt_out;
  vf_base_t exp_out;
  vf_base_t overflow_threshold;
  vf_base_t sgn_out;
  vf_base_t mnt_in;
  vf_base_t exp_in;
  vf_base_t bits_delta;
  vf_base_t mnt_shift;
  vf_status_t *status_local;
  vf_base_t input_local;
  
  uVar1 = (input & profile_in.sgn_mask) >> ((char)profile_in.bits - (char)profile_out.bits & 0x3fU);
  if ((input & profile_in.exp_mask) <
      (profile_in.sgn_mask >> 1 |
      (1L << ((char)profile_out.exp_bits - 1U & 0x3f)) + -1 << ((byte)profile_in.mnt_bits & 0x3f)))
  {
    __assert_fail("exp_in >= overflow_threshold",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0x52,
                  "vf_base_t vf_deflate_with_overflow(vf_base_t, vf_profile_t, vf_profile_t, vf_status_t *)"
                 );
  }
  vf_set_status(status,0);
  if ((input & profile_in.exp_mask) == profile_in.exp_mask) {
    if ((input & profile_in.mnt_mask) != 0) {
      uVar1 = uVar1 + profile_out.exp_mask +
              (1L << ((char)profile_out.mnt_bits - 1U & 0x3f) |
              (input & profile_in.mnt_mask) >>
              ((byte)profile_in.mnt_bits - (char)profile_out.mnt_bits & 0x3f));
      goto LAB_00172afb;
    }
  }
  else {
    vf_set_status(status,-3);
  }
  uVar1 = uVar1 + profile_out.exp_mask;
LAB_00172afb:
  input_local = uVar1 & profile_out.mask;
  return input_local;
}

Assistant:

vf_base_t vf_deflate_with_overflow(vf_base_t input, vf_profile_t profile_in, vf_profile_t profile_out, vf_status_t *status) {
	const vf_base_t mnt_shift = profile_in.mnt_bits - profile_out.mnt_bits;
	const vf_base_t bits_delta = profile_in.bits - profile_out.bits;
	
	vf_base_t exp_in;
	vf_base_t mnt_in;
	vf_base_t sgn_out;
	
	sgn_out = (input & profile_in.sgn_mask) >> bits_delta;
	exp_in = input & profile_in.exp_mask;
	
	const vf_base_t overflow_threshold = (profile_in.sgn_mask >> 1) | ((((vf_base_t)1 << (profile_out.exp_bits - 1)) - 1) << profile_in.mnt_bits);
	assert(exp_in >= overflow_threshold);
	
	vf_set_status(status, VF_STATUS_OK);
	
	if (exp_in == profile_in.exp_mask) {
		// Inf or NaN
		mnt_in = input & profile_in.mnt_mask;
		if (mnt_in != 0) {
			vf_base_t exp_out = profile_out.exp_mask;
			vf_base_t mnt_out = mnt_in >> mnt_shift;
			// Add QNaN bit...
			mnt_out |= ((vf_base_t)1 << (profile_out.mnt_bits - 1));
			const vf_base_t output = (sgn_out + exp_out + mnt_out) & profile_out.mask;
			return output;
		}
	} else {
		// overflow to sgned inf
		vf_set_status(status, VF_STATUS_OVERFLOW);
	}
	vf_base_t output = (sgn_out + profile_out.exp_mask) & profile_out.mask;
	return output;
}